

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O0

int forward_stdin(quicly_conn_t *conn)

{
  int iVar1;
  quicly_stream_t *pqVar2;
  size_t len;
  int *piVar3;
  bool bVar4;
  size_t rret;
  char buf [4096];
  quicly_stream_t *stream0;
  quicly_stream_id_t in_stack_ffffffffffffefe0;
  quicly_conn_t *in_stack_ffffffffffffefe8;
  quicly_stream_t *in_stack_ffffffffffffeff0;
  int local_4;
  
  pqVar2 = quicly_get_stream(in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0);
  if ((pqVar2 == (quicly_stream_t *)0x0) ||
     (iVar1 = quicly_sendstate_is_open(&pqVar2->sendstate), iVar1 == 0)) {
    local_4 = 0;
  }
  else {
    do {
      len = read(0,&stack0xffffffffffffefe8,0x1000);
      bVar4 = false;
      if (len == 0xffffffffffffffff) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    if (len == 0) {
      quicly_streambuf_egress_shutdown((quicly_stream_t *)0x0);
      local_4 = 0;
    }
    else {
      quicly_streambuf_egress_write(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,len);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int forward_stdin(quicly_conn_t *conn)
{
    quicly_stream_t *stream0;
    char buf[4096];
    size_t rret;

    if ((stream0 = quicly_get_stream(conn, 0)) == NULL || !quicly_sendstate_is_open(&stream0->sendstate))
        return 0;

    while ((rret = read(0, buf, sizeof(buf))) == -1 && errno == EINTR)
        ;
    if (rret == 0) {
        /* stdin closed, close the send-side of stream0 */
        quicly_streambuf_egress_shutdown(stream0);
        return 0;
    } else {
        /* write data to send buffer */
        quicly_streambuf_egress_write(stream0, buf, rret);
        return 1;
    }
}